

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animstate.cpp
# Opt level: O2

CAnimState * CAnimState::GetIdle(void)

{
  if (GetIdle()::Init == '\0') {
    Set(&GetIdle::State,g_pData->m_aAnimations,0.0);
    Add(&GetIdle::State,g_pData->m_aAnimations + 1,0.0,1.0);
    GetIdle()::Init = '\x01';
  }
  return &GetIdle::State;
}

Assistant:

CAnimState *CAnimState::GetIdle()
{
	static CAnimState State;
	static bool Init = true;

	if(Init)
	{
		State.Set(&g_pData->m_aAnimations[ANIM_BASE], 0);
		State.Add(&g_pData->m_aAnimations[ANIM_IDLE], 0, 1.0f);
		Init = false;
	}

	return &State;
}